

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

void us_socket_context_on_data
               (int ssl,us_socket_context_t *context,
               _func_us_socket_t_ptr_us_socket_t_ptr_char_ptr_int *on_data)

{
  if (ssl != 0) {
    us_internal_ssl_socket_context_on_data
              ((us_internal_ssl_socket_context_t *)context,
               (_func_us_internal_ssl_socket_t_ptr_us_internal_ssl_socket_t_ptr_char_ptr_int *)
               on_data);
    return;
  }
  context->on_data = on_data;
  return;
}

Assistant:

void us_socket_context_on_data(int ssl, struct us_socket_context_t *context, struct us_socket_t *(*on_data)(struct us_socket_t *s, char *data, int length)) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        us_internal_ssl_socket_context_on_data((struct us_internal_ssl_socket_context_t *) context, (struct us_internal_ssl_socket_t * (*)(struct us_internal_ssl_socket_t *, char *, int)) on_data);
        return;
    }
#endif

    context->on_data = on_data;
}